

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * re2::Regexp::Quest(Regexp *sub,ParseFlags flags)

{
  RegexpOp RVar1;
  ParseFlags PVar2;
  Regexp **ppRVar3;
  Regexp *re;
  ParseFlags flags_local;
  Regexp *sub_local;
  
  RVar1 = op(sub);
  if ((RVar1 != kRegexpQuest) || (PVar2 = parse_flags(sub), sub_local = sub, PVar2 != flags)) {
    sub_local = (Regexp *)operator_new(0x28);
    Regexp(sub_local,kRegexpQuest,flags);
    AllocSub(sub_local,1);
    ppRVar3 = Regexp::sub(sub_local);
    *ppRVar3 = sub;
  }
  return sub_local;
}

Assistant:

Regexp* Regexp::Quest(Regexp* sub, ParseFlags flags) {
  if (sub->op() == kRegexpQuest && sub->parse_flags() == flags)
    return sub;
  Regexp* re = new Regexp(kRegexpQuest, flags);
  re->AllocSub(1);
  re->sub()[0] = sub;
  return re;
}